

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableMessageOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "private com.google.protobuf.SingleFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
                    );
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableMessageFieldGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableMessageFieldGenerator).descriptor_,GETTER,false);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$()",
             "if ($has_oneof_case_message$) {\n  return ($type$) $oneof_name$_;\n}\nreturn $type$.getDefaultInstance();\n"
             ,
             "if ($has_oneof_case_message$) {\n  return $name$Builder_.getMessage();\n}\nreturn $type$.getDefaultInstance();\n"
             ,(char *)0x0);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$oneof_name$_ = value;\n$on_changed$\n"
             ,"$name$Builder_.setMessage(value);\n","$set_oneof_case_message$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    $type$.Builder builderForValue)"
             ,"$oneof_name$_ = builderForValue.build();\n$on_changed$\n",
             "$name$Builder_.setMessage(builderForValue.build());\n",
             "$set_oneof_case_message$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",
             "if ($has_oneof_case_message$ &&\n    $oneof_name$_ != $type$.getDefaultInstance()) {\n  $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n      .mergeFrom(value).buildPartial();\n} else {\n  $oneof_name$_ = value;\n}\n$on_changed$\n"
             ,
             "if ($has_oneof_case_message$) {\n  $name$Builder_.mergeFrom(value);\n}\n$name$Builder_.setMessage(value);\n"
             ,"$set_oneof_case_message$;\nreturn this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$()",
             "if ($has_oneof_case_message$) {\n  $clear_oneof_case_message$;\n  $oneof_name$_ = null;\n  $on_changed$\n}\n"
             ,
             "if ($has_oneof_case_message$) {\n  $clear_oneof_case_message$;\n  $oneof_name$_ = null;\n}\n$name$Builder_.clear();\n"
             ,"return this;\n");
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "$deprecation$public $type$.Builder ${$get$capitalized_name$Builder$}$() {\n  return get$capitalized_name$FieldBuilder().getBuilder();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$() {\n  if (($has_oneof_case_message$) && ($name$Builder_ != null)) {\n    return $name$Builder_.getMessageOrBuilder();\n  } else {\n    if ($has_oneof_case_message$) {\n      return ($type$) $oneof_name$_;\n    }\n    return $type$.getDefaultInstance();\n  }\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "private com.google.protobuf.SingleFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> \n    ${$get$capitalized_name$FieldBuilder$}$() {\n  if ($name$Builder_ == null) {\n    if (!($has_oneof_case_message$)) {\n      $oneof_name$_ = $type$.getDefaultInstance();\n    }\n    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder$ver$<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            ($type$) $oneof_name$_,\n            getParentForChildren(),\n            isClean());\n    $oneof_name$_ = null;\n  }\n  $set_oneof_case_message$;\n  $on_changed$;\n  return $name$Builder_;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.
  printer->Print(variables_,
                 // If this builder is non-null, it is used and the other fields
                 // are ignored.
                 "private com.google.protobuf.SingleFieldBuilder$ver$<\n"
                 "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
                 "\n");

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field getField()
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  PrintNestedBuilderFunction(
      printer,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$()",

      "if ($has_oneof_case_message$) {\n"
      "  return ($type$) $oneof_name$_;\n"
      "}\n"
      "return $type$.getDefaultInstance();\n",

      "if ($has_oneof_case_message$) {\n"
      "  return $name$Builder_.getMessage();\n"
      "}\n"
      "return $type$.getDefaultInstance();\n",

      NULL);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",

      "if (value == null) {\n"
      "  throw new NullPointerException();\n"
      "}\n"
      "$oneof_name$_ = value;\n"
      "$on_changed$\n",

      "$name$Builder_.setMessage(value);\n",

      "$set_oneof_case_message$;\n"
      "return this;\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
      "    $type$.Builder builderForValue)",

      "$oneof_name$_ = builderForValue.build();\n"
      "$on_changed$\n",

      "$name$Builder_.setMessage(builderForValue.build());\n",

      "$set_oneof_case_message$;\n"
      "return this;\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",

      "if ($has_oneof_case_message$ &&\n"
      "    $oneof_name$_ != $type$.getDefaultInstance()) {\n"
      "  $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n"
      "      .mergeFrom(value).buildPartial();\n"
      "} else {\n"
      "  $oneof_name$_ = value;\n"
      "}\n"
      "$on_changed$\n",

      "if ($has_oneof_case_message$) {\n"
      "  $name$Builder_.mergeFrom(value);\n"
      "}\n"
      "$name$Builder_.setMessage(value);\n",

      "$set_oneof_case_message$;\n"
      "return this;\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(
      printer, "$deprecation$public Builder ${$clear$capitalized_name$$}$()",

      "if ($has_oneof_case_message$) {\n"
      "  $clear_oneof_case_message$;\n"
      "  $oneof_name$_ = null;\n"
      "  $on_changed$\n"
      "}\n",

      "if ($has_oneof_case_message$) {\n"
      "  $clear_oneof_case_message$;\n"
      "  $oneof_name$_ = null;\n"
      "}\n"
      "$name$Builder_.clear();\n",

      "return this;\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "$deprecation$public $type$.Builder "
                 "${$get$capitalized_name$Builder$}$() {\n"
                 "  return get$capitalized_name$FieldBuilder().getBuilder();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$OrBuilder "
      "${$get$capitalized_name$OrBuilder$}$() {\n"
      "  if (($has_oneof_case_message$) && ($name$Builder_ != null)) {\n"
      "    return $name$Builder_.getMessageOrBuilder();\n"
      "  } else {\n"
      "    if ($has_oneof_case_message$) {\n"
      "      return ($type$) $oneof_name$_;\n"
      "    }\n"
      "    return $type$.getDefaultInstance();\n"
      "  }\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(
      variables_,
      "private com.google.protobuf.SingleFieldBuilder$ver$<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> \n"
      "    ${$get$capitalized_name$FieldBuilder$}$() {\n"
      "  if ($name$Builder_ == null) {\n"
      "    if (!($has_oneof_case_message$)) {\n"
      "      $oneof_name$_ = $type$.getDefaultInstance();\n"
      "    }\n"
      "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder$ver$<\n"
      "        $type$, $type$.Builder, $type$OrBuilder>(\n"
      "            ($type$) $oneof_name$_,\n"
      "            getParentForChildren(),\n"
      "            isClean());\n"
      "    $oneof_name$_ = null;\n"
      "  }\n"
      "  $set_oneof_case_message$;\n"
      "  $on_changed$;\n"
      "  return $name$Builder_;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}